

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkRevoluteSpherical::ArchiveOUT(ChLinkRevoluteSpherical *this,ChArchiveOut *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkRevoluteSpherical>(marchive);
  ChLink::ArchiveOUT(&this->super_ChLink,marchive);
  local_38._value = &this->m_pos1;
  local_38._name = "m_pos1";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->m_pos2;
  local_38._name = "m_pos2";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = &this->m_dir1;
  local_38._name = "m_dir1";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChVector<double>>(marchive,&local_38);
  local_38._value = (ChVector<double> *)&this->m_dist;
  local_38._name = "m_dist";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  return;
}

Assistant:

void ChLinkRevoluteSpherical::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkRevoluteSpherical>();

    // serialize parent class
    ChLink::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(m_pos1);
    marchive << CHNVP(m_pos2);
    marchive << CHNVP(m_dir1);
    marchive << CHNVP(m_dist);
}